

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall edition_unittest::TestUnpackedTypes::ByteSizeLong(TestUnpackedTypes *this)

{
  int iVar1;
  RepeatedField<int> *pRVar2;
  size_t sVar3;
  size_t sVar4;
  RepeatedField<long> *pRVar5;
  size_t sVar6;
  size_t sVar7;
  RepeatedField<unsigned_int> *value;
  size_t sVar8;
  size_t sVar9;
  RepeatedField<unsigned_long> *value_00;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  size_t sVar24;
  size_t sVar25;
  size_t sVar26;
  size_t sVar27;
  size_t sVar28;
  size_t sVar29;
  size_t sVar30;
  size_t sVar31;
  size_t tag_size_13;
  size_t data_size_13;
  size_t tag_size_12;
  size_t data_size_12;
  size_t tag_size_11;
  size_t data_size_11;
  size_t tag_size_10;
  size_t data_size_10;
  size_t tag_size_9;
  size_t data_size_9;
  size_t tag_size_8;
  size_t data_size_8;
  size_t tag_size_7;
  size_t data_size_7;
  size_t tag_size_6;
  size_t data_size_6;
  size_t tag_size_5;
  size_t data_size_5;
  size_t tag_size_4;
  size_t data_size_4;
  size_t tag_size_3;
  size_t data_size_3;
  size_t tag_size_2;
  size_t data_size_2;
  size_t tag_size_1;
  size_t data_size_1;
  size_t tag_size;
  size_t data_size;
  uint32_t cached_has_bits;
  size_t total_size;
  TestUnpackedTypes *this_;
  TestUnpackedTypes *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar2 = _internal_unpacked_int32(this);
  sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(pRVar2);
  iVar1 = _internal_unpacked_int32_size(this);
  sVar4 = google::protobuf::internal::FromIntSize(iVar1);
  pRVar5 = _internal_unpacked_int64(this);
  sVar6 = google::protobuf::internal::WireFormatLite::Int64Size(pRVar5);
  iVar1 = _internal_unpacked_int64_size(this);
  sVar7 = google::protobuf::internal::FromIntSize(iVar1);
  value = _internal_unpacked_uint32(this);
  sVar8 = google::protobuf::internal::WireFormatLite::UInt32Size(value);
  iVar1 = _internal_unpacked_uint32_size(this);
  sVar9 = google::protobuf::internal::FromIntSize(iVar1);
  value_00 = _internal_unpacked_uint64(this);
  sVar10 = google::protobuf::internal::WireFormatLite::UInt64Size(value_00);
  iVar1 = _internal_unpacked_uint64_size(this);
  sVar11 = google::protobuf::internal::FromIntSize(iVar1);
  pRVar2 = _internal_unpacked_sint32(this);
  sVar12 = google::protobuf::internal::WireFormatLite::SInt32Size(pRVar2);
  iVar1 = _internal_unpacked_sint32_size(this);
  sVar13 = google::protobuf::internal::FromIntSize(iVar1);
  pRVar5 = _internal_unpacked_sint64(this);
  sVar14 = google::protobuf::internal::WireFormatLite::SInt64Size(pRVar5);
  iVar1 = _internal_unpacked_sint64_size(this);
  sVar15 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_fixed32_size(this);
  sVar16 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_fixed32_size(this);
  sVar17 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_fixed64_size(this);
  sVar18 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_fixed64_size(this);
  sVar19 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_sfixed32_size(this);
  sVar20 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_sfixed32_size(this);
  sVar21 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_sfixed64_size(this);
  sVar22 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_sfixed64_size(this);
  sVar23 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_float_size(this);
  sVar24 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_float_size(this);
  sVar25 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_double_size(this);
  sVar26 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_double_size(this);
  sVar27 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_bool_size(this);
  sVar28 = google::protobuf::internal::FromIntSize(iVar1);
  iVar1 = _internal_unpacked_bool_size(this);
  sVar29 = google::protobuf::internal::FromIntSize(iVar1);
  pRVar2 = _internal_unpacked_enum(this);
  sVar30 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar2);
  iVar1 = _internal_unpacked_enum_size(this);
  sVar31 = google::protobuf::internal::FromIntSize(iVar1);
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,
                     sVar30 + sVar31 * 2 +
                     sVar29 * 2 + sVar28 +
                     sVar27 * 2 + sVar26 * 8 +
                     sVar25 * 2 + sVar24 * 4 +
                     sVar23 * 2 + sVar22 * 8 +
                     sVar21 * 2 + sVar20 * 4 +
                     sVar19 * 2 + sVar18 * 8 +
                     sVar17 * 2 + sVar16 * 4 +
                     sVar15 * 2 + sVar14 +
                     sVar13 * 2 + sVar12 +
                     sVar11 * 2 + sVar10 + sVar9 * 2 + sVar8 + sVar7 * 2 + sVar6 + sVar4 * 2 + sVar3
                     ,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestUnpackedTypes::ByteSizeLong() const {
  const TestUnpackedTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestUnpackedTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 unpacked_int32 = 90 [features = {
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_unpacked_int32());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_int32_size());
      total_size += tag_size + data_size;
    }
    // repeated int64 unpacked_int64 = 91 [features = {
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int64Size(
          this_._internal_unpacked_int64());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_int64_size());
      total_size += tag_size + data_size;
    }
    // repeated uint32 unpacked_uint32 = 92 [features = {
    {
      ::size_t data_size = ::_pbi::WireFormatLite::UInt32Size(
          this_._internal_unpacked_uint32());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_uint32_size());
      total_size += tag_size + data_size;
    }
    // repeated uint64 unpacked_uint64 = 93 [features = {
    {
      ::size_t data_size = ::_pbi::WireFormatLite::UInt64Size(
          this_._internal_unpacked_uint64());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_uint64_size());
      total_size += tag_size + data_size;
    }
    // repeated sint32 unpacked_sint32 = 94 [features = {
    {
      ::size_t data_size = ::_pbi::WireFormatLite::SInt32Size(
          this_._internal_unpacked_sint32());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_sint32_size());
      total_size += tag_size + data_size;
    }
    // repeated sint64 unpacked_sint64 = 95 [features = {
    {
      ::size_t data_size = ::_pbi::WireFormatLite::SInt64Size(
          this_._internal_unpacked_sint64());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_sint64_size());
      total_size += tag_size + data_size;
    }
    // repeated fixed32 unpacked_fixed32 = 96 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_unpacked_fixed32_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_fixed32_size());
      total_size += tag_size + data_size;
    }
    // repeated fixed64 unpacked_fixed64 = 97 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_unpacked_fixed64_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_fixed64_size());
      total_size += tag_size + data_size;
    }
    // repeated sfixed32 unpacked_sfixed32 = 98 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_unpacked_sfixed32_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_sfixed32_size());
      total_size += tag_size + data_size;
    }
    // repeated sfixed64 unpacked_sfixed64 = 99 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_unpacked_sfixed64_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_sfixed64_size());
      total_size += tag_size + data_size;
    }
    // repeated float unpacked_float = 100 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_unpacked_float_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_float_size());
      total_size += tag_size + data_size;
    }
    // repeated double unpacked_double = 101 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_unpacked_double_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_double_size());
      total_size += tag_size + data_size;
    }
    // repeated bool unpacked_bool = 102 [features = {
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_unpacked_bool_size());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_bool_size());
      total_size += tag_size + data_size;
    }
    // repeated .edition_unittest.ForeignEnum unpacked_enum = 103 [features = {
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_unpacked_enum());
      ::size_t tag_size = ::size_t{2} *
          ::_pbi::FromIntSize(this_._internal_unpacked_enum_size());
      total_size += data_size + tag_size;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}